

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::removeMember(Value *this,char *key,char *cend,Value *removed)

{
  bool bVar1;
  pointer ppVar2;
  Value local_90;
  undefined4 local_64;
  _Self local_60 [3];
  _Self local_48;
  iterator it;
  CZString actualKey;
  Value *removed_local;
  char *cend_local;
  char *key_local;
  Value *this_local;
  
  if ((*(ushort *)&this->field_0x8 & 0xff) == 7) {
    removed_local._0_4_ = (int)cend;
    CZString::CZString((CZString *)&it,key,(int)removed_local - (int)key,noDuplication);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::find((this->value_).map_,(CZString *)&it);
    local_60[0]._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((this->value_).map_);
    bVar1 = std::operator==(&local_48,local_60);
    if (!bVar1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator->(&local_48);
      Value(&local_90,&ppVar2->second);
      operator=(removed,&local_90);
      ~Value(&local_90);
      std::
      map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
      ::erase_abi_cxx11_((map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                          *)(this->value_).map_,(iterator)local_48._M_node);
    }
    this_local._7_1_ = !bVar1;
    local_64 = 1;
    CZString::~CZString((CZString *)&it);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::removeMember(const char* key, const char* cend, Value* removed)
{
  if (type_ != objectValue) {
    return false;
  }
  CZString actualKey(key, static_cast<unsigned>(cend-key), CZString::noDuplication);
  ObjectValues::iterator it = value_.map_->find(actualKey);
  if (it == value_.map_->end())
    return false;
  *removed = it->second;
  value_.map_->erase(it);
  return true;
}